

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::add_escaped_characters(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      lVar3 = ::std::__cxx11::string::find(-0x60,(ulong)(uint)(int)pcVar2[sVar4]);
      if (lVar3 != -1) {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string add_escaped_characters(const std::string &str) {
    std::string out;
    out.reserve(str.size() + 4);
    for(char s : str) {
        auto sloc = escapedChars.find_first_of(s);
        if(sloc != std::string::npos) {
            out.push_back('\\');
            out.push_back(escapedCharsCode[sloc]);
        } else {
            out.push_back(s);
        }
    }
    return out;
}